

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

filepos_t GetBlockFrameSize(matroska_block *Element,size_t Frame,ebml_element *Header,
                           MatroskaTrackEncodingCompAlgo CompAlgo,
                           MatroskaContentEncodingScope CompScope)

{
  int iVar1;
  ebml_context *peVar2;
  ebml_context *peVar3;
  err_t eVar4;
  filepos_t fVar5;
  uint8_t *Data;
  size_t OutSize;
  size_t FrameNum;
  size_t PrevFramesSize;
  MatroskaContentEncodingScope CompScope_local;
  MatroskaTrackEncodingCompAlgo CompAlgo_local;
  ebml_element *Header_local;
  size_t Frame_local;
  matroska_block *Element_local;
  
  PrevFramesSize._0_4_ = CompScope;
  PrevFramesSize._4_4_ = CompAlgo;
  _CompScope_local = Header;
  Header_local = (ebml_element *)Frame;
  Frame_local = (size_t)Element;
  if (Element == (matroska_block *)0xffffffffffffff78) {
    __assert_fail("&(Element->SizeList)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x62c,
                  "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                 );
  }
  if (Frame < (Element->SizeList)._Used >> 2) {
    if ((Header == (ebml_element *)0x0) || ((CompScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK) == 0))
    {
      if (Element == (matroska_block *)0xffffffffffffff78) {
        __assert_fail("&(Element->SizeList)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x630,
                      "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                     );
      }
      Element_local = (matroska_block *)(long)*(int *)((Element->SizeList)._Begin + Frame * 4);
    }
    else {
      peVar2 = Header->Context;
      peVar3 = MATROSKA_getContextContentCompAlgo();
      if (peVar2 == peVar3) {
        if (*(char *)(Frame_local + 0x65) == '\0') {
          __assert_fail("Element->Base.Base.bValueIsSet",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x633,
                        "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                       );
        }
        if (*(char *)(Frame_local + 0x65) == '\0') {
          if (Frame_local == 0xffffffffffffff78) {
            __assert_fail("&(Element->SizeList)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x635,
                          "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                         );
          }
          Element_local =
               (matroska_block *)
               (long)*(int *)(*(long *)(Frame_local + 0x88) + (long)Header_local * 4);
        }
        else {
          FrameNum = 0;
          for (OutSize = 0; OutSize < Header_local; OutSize = OutSize + 1) {
            if (Frame_local == 0xffffffffffffff78) {
              __assert_fail("&(Element->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x63a,
                            "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                           );
            }
            FrameNum = (long)*(int *)(*(long *)(Frame_local + 0x88) + OutSize * 4) + FrameNum;
          }
          if (Frame_local == 0xffffffffffffff78) {
            __assert_fail("&(Element->SizeList)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x63d,
                          "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                         );
          }
          Data = (uint8_t *)(long)*(int *)(*(long *)(Frame_local + 0x88) + (long)Header_local * 4);
          if (Frame_local == 0xffffffffffffff58) {
            __assert_fail("&(Element->Data)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x63e,
                          "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                         );
          }
          if (*(uint8_t **)(Frame_local + 0xb0) < Data + FrameNum) {
            __assert_fail("(PrevFramesSize + OutSize) <= ARRAYCOUNT(Element->Data,uint8_t)",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x63e,
                          "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                         );
          }
          if (Frame_local == 0xffffffffffffff58) {
            __assert_fail("&(Element->Data)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x63f,
                          "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                         );
          }
          if (PrevFramesSize._4_4_ == MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
            if (Frame_local == 0xffffffffffffff78) {
              __assert_fail("&(Element->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x642,
                            "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                           );
            }
            eVar4 = CompressFrameZLib((uint8_t *)(*(long *)(Frame_local + 0xa8) + FrameNum),
                                      (long)*(int *)(*(long *)(Frame_local + 0x88) +
                                                    (long)Header_local * 4),(uint8_t **)0x0,
                                      (size_t *)&Data);
            if (eVar4 != 0) {
              if (Frame_local != 0xffffffffffffff78) {
                return (long)*(int *)(*(long *)(Frame_local + 0x88) + (long)Header_local * 4);
              }
              __assert_fail("&(Element->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x643,
                            "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                           );
            }
          }
          Element_local = (matroska_block *)Data;
        }
      }
      else {
        if (Frame_local == 0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x648,
                        "filepos_t GetBlockFrameSize(const matroska_block *, size_t, const ebml_element *, MatroskaTrackEncodingCompAlgo, MatroskaContentEncodingScope)"
                       );
        }
        iVar1 = *(int *)(*(long *)(Frame_local + 0x88) + (long)Header_local * 4);
        fVar5 = EBML_ElementDataSize(_CompScope_local,1);
        Element_local = (matroska_block *)(iVar1 - fVar5);
      }
    }
  }
  else {
    Element_local = (matroska_block *)0x0;
  }
  return (filepos_t)Element_local;
}

Assistant:

static filepos_t GetBlockFrameSize(const matroska_block *Element, size_t Frame, const ebml_element *Header,
                                   MatroskaTrackEncodingCompAlgo CompAlgo, MatroskaContentEncodingScope CompScope)
{
    if (Frame >= ARRAYCOUNT(Element->SizeList,int32_t))
        return 0;

    if (!Header || (CompScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK)==0)
        return ARRAYBEGIN(Element->SizeList,int32_t)[Frame];
    if (Header->Context==MATROSKA_getContextContentCompAlgo())
    {
        assert(Element->Base.Base.bValueIsSet);
        if (!Element->Base.Base.bValueIsSet)
            return ARRAYBEGIN(Element->SizeList,int32_t)[Frame]; // we can't tell the final size without decoding the data

        // skip previous frames data
        size_t PrevFramesSize = 0;
        for (size_t FrameNum=0; FrameNum<Frame; FrameNum++)
            PrevFramesSize += ARRAYBEGIN(Element->SizeList,int32_t)[FrameNum];

        // handle zlib
        size_t OutSize = ARRAYBEGIN(Element->SizeList,int32_t)[Frame];
        assert((PrevFramesSize + OutSize) <= ARRAYCOUNT(Element->Data,uint8_t));
        const uint8_t *Data = ARRAYBEGIN(Element->Data,uint8_t) + PrevFramesSize;
#if defined(CONFIG_EBML_WRITING)
#if defined(CONFIG_ZLIB)
        if (CompAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB && CompressFrameZLib(Data,ARRAYBEGIN(Element->SizeList,int32_t)[Frame],NULL,&OutSize)!=ERR_NONE)
            return ARRAYBEGIN(Element->SizeList,int32_t)[Frame]; // we can't tell the final size without decoding the data
#endif
#endif
        return OutSize;
    }
    return ARRAYBEGIN(Element->SizeList,int32_t)[Frame] - EBML_ElementDataSize(Header, 1); // header stripping
}